

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

Module * __thiscall wabt::Script::GetModule(Script *this,Var *var)

{
  Command *base;
  Index IVar1;
  ModuleCommand *pMVar2;
  Module *pMVar3;
  
  IVar1 = BindingHash::FindIndex(&this->module_bindings,var);
  if ((ulong)IVar1 < (ulong)(*(long *)&this->field_0x8 - *(long *)this >> 3)) {
    base = *(Command **)(*(long *)this + (ulong)IVar1 * 8);
    if (*(int *)(base + 8) == 1) {
      pMVar2 = (ModuleCommand *)cast<wabt::ScriptModuleCommand,wabt::Command>(base);
    }
    else {
      if (*(int *)(base + 8) != 0) goto LAB_0012a073;
      pMVar2 = cast<wabt::ModuleCommand,wabt::Command>(base);
    }
    pMVar3 = (Module *)(pMVar2 + 0x10);
  }
  else {
LAB_0012a073:
    pMVar3 = (Module *)0x0;
  }
  return pMVar3;
}

Assistant:

const Module* Script::GetModule(const Var& var) const {
  Index index = module_bindings.FindIndex(var);
  if (index >= commands.size()) {
    return nullptr;
  }
  auto* command = commands[index].get();
  if (isa<ModuleCommand>(command)) {
    return &cast<ModuleCommand>(command)->module;
  } else if (isa<ScriptModuleCommand>(command)) {
    return &cast<ScriptModuleCommand>(command)->module;
  }
  return nullptr;
}